

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  value_type vVar1;
  int iVar2;
  istream *piVar3;
  ostream *poVar4;
  char separator;
  double y;
  double x;
  ifstream file;
  byte abStack_870 [488];
  regression<double,_64UL> filter;
  
  if (argc == 2) {
    memset(&filter,0,0x400);
    filter.super_basic_comoment<double,_64UL,_(trial::online::with)2>.window.
    super_span<std::pair<double,_double>,_64UL>.member.size = 0;
    filter.super_basic_comoment<double,_64UL,_(trial::online::with)2>.window.
    super_span<std::pair<double,_double>,_64UL>.member.next = 0x40;
    filter.super_basic_comoment<double,_64UL,_(trial::online::with)2>.window.
    super_span<std::pair<double,_double>,_64UL>.member.data = (pointer)&filter;
    memset(&filter.super_basic_comoment<double,_64UL,_(trial::online::with)2>.sum,0,0x218);
    filter.x_moment.super_basic_moment<double,_64UL,_(trial::online::with)1>.member.window.
    super_span<double,_64UL>.member.size = 0;
    filter.x_moment.super_basic_moment<double,_64UL,_(trial::online::with)1>.member.window.
    super_span<double,_64UL>.member.next = 0x40;
    filter.x_moment.super_basic_moment<double,_64UL,_(trial::online::with)1>.member.mean = 0.0;
    filter.x_moment.sum.variance = 0.0;
    filter.x_moment.super_basic_moment<double,_64UL,_(trial::online::with)1>.member.window.
    super_span<double,_64UL>.member.data = (pointer)&filter.x_moment;
    std::ifstream::ifstream(&file,argv[1],_S_in);
    while ((abStack_870[*(long *)(_file + -0x18)] & 5) == 0) {
      piVar3 = std::istream::_M_extract<double>((double *)&file);
      piVar3 = std::operator>>(piVar3,&separator);
      std::istream::_M_extract<double>((double *)piVar3);
      trial::online::window::regression<double,_64UL>::push(&filter,x,y);
      poVar4 = std::ostream::_M_insert<double>(x);
      std::operator<<(poVar4,',');
      poVar4 = std::ostream::_M_insert<double>(y);
      std::operator<<(poVar4,',');
      vVar1 = trial::online::window::regression<double,_64UL>::slope(&filter);
      poVar4 = std::ostream::_M_insert<double>(vVar1);
      std::operator<<(poVar4,',');
      vVar1 = trial::online::window::regression<double,_64UL>::at(&filter,0.0);
      poVar4 = std::ostream::_M_insert<double>(vVar1);
      std::operator<<(poVar4,'\n');
    }
    std::ifstream::~ifstream(&file);
    iVar2 = 0;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar4 = std::operator<<(poVar4,*argv);
    poVar4 = std::operator<<(poVar4," <file>");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, const char *argv[])
{
    if (argc != 2)
    {
        std::cerr << "Usage: " << argv[0] << " <file>" << std::endl;
        return 1;
    }

    window::regression<double, 64> filter;

    double x;
    double y;
    char separator;

    std::ifstream file(argv[1]);
    while (file)
    {
        file >> x >> separator >> y;
        filter.push(x, y);
        std::cout << x << ',' << y << ',' << filter.slope() << ',' << filter.at(0) << '\n';
    }
    return 0;
}